

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void av1_write_tx_type(AV1_COMMON *cm,MACROBLOCKD *xd,TX_TYPE tx_type,TX_SIZE tx_size,aom_writer *w)

{
  PREDICTION_MODE PVar1;
  long lVar2;
  TxSetType TVar3;
  int is_inter_00;
  int iVar4;
  byte in_CL;
  long in_RSI;
  long in_RDI;
  PREDICTION_MODE intra_dir;
  int eset;
  TxSetType tx_set_type;
  TX_SIZE square_tx_size;
  FRAME_CONTEXT *ec_ctx;
  int is_inter;
  FeatureFlags *features;
  MB_MODE_INFO *mbmi;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar5;
  aom_writer *w_00;
  
  lVar2 = **(long **)(in_RSI + 0x1eb8);
  is_inter_00 = is_inter_block((MB_MODE_INFO *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  iVar4 = get_ext_tx_types((TX_SIZE)((uint)in_stack_ffffffffffffffb4 >> 0x18),
                           in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if ((1 < iVar4) &&
     ((((*(char *)(in_RDI + 19000) == '\0' && (0 < *(int *)(in_RDI + 0x268))) ||
       ((*(char *)(in_RDI + 19000) != '\0' &&
        (0 < *(int *)(in_RSI + 0x29a4 + (ulong)((byte)*(undefined2 *)(lVar2 + 0xa7) & 7) * 4))))) &&
      ((*(char *)(lVar2 + 0x90) == '\0' &&
       (iVar4 = segfeature_active((segmentation *)(in_RDI + 19000),
                                  (byte)*(undefined2 *)(lVar2 + 0xa7) & 7,'\x06'), iVar4 == 0))))))
  {
    w_00 = *(aom_writer **)(in_RSI + 0x2998);
    uVar5 = CONCAT13(""[in_CL],(int3)in_stack_ffffffffffffffbc);
    TVar3 = av1_get_ext_tx_set_type(in_CL,is_inter_00,(uint)(*(byte *)(in_RDI + 0x1f5) & 1));
    iVar4 = CONCAT13((char)((uint)uVar5 >> 0x18),CONCAT12(TVar3,(short)uVar5));
    get_ext_tx_set((TX_SIZE)((uint)in_stack_ffffffffffffffb4 >> 0x18),in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffac);
    if (is_inter_00 == 0) {
      if (*(char *)(lVar2 + 0x5b) == '\0') {
        PVar1 = *(PREDICTION_MODE *)(lVar2 + 2);
      }
      else {
        PVar1 = ""[*(byte *)(lVar2 + 0x5a)];
      }
      aom_write_symbol(w_00,iVar4,
                       (aom_cdf_prob *)
                       CONCAT44(CONCAT13(PVar1,(int3)in_stack_ffffffffffffffb4),
                                in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac);
    }
    else {
      aom_write_symbol(w_00,iVar4,
                       (aom_cdf_prob *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                       ,in_stack_ffffffffffffffac);
    }
  }
  return;
}

Assistant:

void av1_write_tx_type(const AV1_COMMON *const cm, const MACROBLOCKD *xd,
                       TX_TYPE tx_type, TX_SIZE tx_size, aom_writer *w) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const FeatureFlags *const features = &cm->features;
  const int is_inter = is_inter_block(mbmi);
  if (get_ext_tx_types(tx_size, is_inter, features->reduced_tx_set_used) > 1 &&
      ((!cm->seg.enabled && cm->quant_params.base_qindex > 0) ||
       (cm->seg.enabled && xd->qindex[mbmi->segment_id] > 0)) &&
      !mbmi->skip_txfm &&
      !segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP)) {
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    const TX_SIZE square_tx_size = txsize_sqr_map[tx_size];
    const TxSetType tx_set_type = av1_get_ext_tx_set_type(
        tx_size, is_inter, features->reduced_tx_set_used);
    const int eset =
        get_ext_tx_set(tx_size, is_inter, features->reduced_tx_set_used);
    // eset == 0 should correspond to a set with only DCT_DCT and there
    // is no need to send the tx_type
    assert(eset > 0);
    assert(av1_ext_tx_used[tx_set_type][tx_type]);
    if (is_inter) {
      aom_write_symbol(w, av1_ext_tx_ind[tx_set_type][tx_type],
                       ec_ctx->inter_ext_tx_cdf[eset][square_tx_size],
                       av1_num_ext_tx_set[tx_set_type]);
    } else {
      PREDICTION_MODE intra_dir;
      if (mbmi->filter_intra_mode_info.use_filter_intra)
        intra_dir =
            fimode_to_intradir[mbmi->filter_intra_mode_info.filter_intra_mode];
      else
        intra_dir = mbmi->mode;
      aom_write_symbol(
          w, av1_ext_tx_ind[tx_set_type][tx_type],
          ec_ctx->intra_ext_tx_cdf[eset][square_tx_size][intra_dir],
          av1_num_ext_tx_set[tx_set_type]);
    }
  }
}